

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O2

void __thiscall Math_TwoSum_Test::TestBody(Math_TwoSum_Test *this)

{
  float fVar1;
  float fVar2;
  int maxExp;
  int maxExp_00;
  int minExp;
  uint64_t uVar3;
  char *pcVar4;
  uint64_t sequenceIndex;
  Float FVar5;
  Float FVar6;
  AssertHelper local_78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertionResult gtest_ar;
  anon_class_8_1_ba1d750b r;
  RNG rng;
  
  for (sequenceIndex = 0; sequenceIndex != 100000; sequenceIndex = sequenceIndex + 1) {
    uVar3 = sequenceIndex;
    pbrt::RNG::SetSequence(&rng,sequenceIndex);
    minExp = (int)uVar3;
    r.rng = &rng;
    FVar5 = TestBody::anon_class_8_1_ba1d750b::operator()(&r,minExp,maxExp);
    FVar6 = TestBody::anon_class_8_1_ba1d750b::operator()(&r,minExp,maxExp_00);
    fVar1 = FVar5 + FVar6;
    local_78.data_._0_4_ = fVar1;
    fVar2 = (FVar5 - (fVar1 - FVar6)) + (FVar6 - (fVar1 - (fVar1 - FVar6)));
    local_70.ptr_._0_4_ = fVar1 + fVar2;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&gtest_ar,"(Float)tp","a + b",(float *)&local_70,(float *)&local_78);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                 ,0x3a0,pcVar4);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_70);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_70.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((double)fVar1 + (double)fVar2);
    local_78.data_ = (AssertHelperData *)((double)FVar5 + (double)FVar6);
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar,"(double)tp","(double)a + (double)b",(double *)&local_70,
               (double *)&local_78);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                 ,0x3a1,pcVar4);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_70);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(Math, TwoSum) {
    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        auto r = [&rng](int minExp = -10, int maxExp = 10) {
            Float logu = Lerp(rng.Uniform<Float>(), minExp, maxExp);
            Float val = std::pow(10, logu);
            Float sign = rng.Uniform<Float>() < .5 ? -1. : 1.;
            return val * sign;
        };

        Float a = r(), b = r();
        CompensatedFloat tp = TwoSum(a, b);
        EXPECT_EQ((Float)tp, a + b);
        EXPECT_EQ((double)tp, (double)a + (double)b);
    }
}